

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::COBImporter::BuildNodes(COBImporter *this,Node *root,Scene *scin,aiScene *fill)

{
  float fVar1;
  ai_real aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Type TVar9;
  Shader SVar10;
  Face *pFVar11;
  pointer pVVar12;
  undefined8 uVar13;
  pointer pMVar14;
  element_type *peVar15;
  _Map_pointer pppNVar16;
  Node **ppNVar17;
  Node **ppNVar18;
  undefined1 auVar19 [16];
  ai_real aVar20;
  ai_real aVar21;
  ai_real aVar22;
  ai_real aVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  Material *__ptr;
  aiScene *paVar38;
  Scene *scin_00;
  undefined1 *puVar39;
  _Rb_tree_node_base *p_Var40;
  uint uVar41;
  int iVar42;
  aiNode *this_00;
  aiMesh *paVar43;
  ulong uVar44;
  aiVector3D *paVar45;
  ulong *puVar46;
  aiFace *paVar47;
  long lVar48;
  uint *puVar49;
  pointer pVVar50;
  Logger *this_01;
  pointer pMVar51;
  aiMaterial *this_02;
  _Rb_tree_node_base *p_Var52;
  aiLight *paVar53;
  aiCamera *paVar54;
  aiNode **__s;
  aiNode *paVar55;
  uint uVar56;
  _Map_pointer pppFVar57;
  aiFace *paVar58;
  _Elt_pointer ppFVar59;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *__range4;
  Light *ndlight;
  _Elt_pointer ppFVar60;
  _Elt_pointer ppFVar61;
  _Map_pointer pppNVar62;
  Material *m;
  ulong uVar63;
  size_t sVar64;
  _Rb_tree_node_base *p_Var65;
  Node **ppNVar66;
  bool bVar67;
  int tmp;
  aiString s;
  Material *local_698;
  aiScene *local_690;
  Scene *local_688;
  _Map_pointer local_680;
  _Elt_pointer local_678;
  shared_ptr<Assimp::COB::Texture> local_670;
  shared_ptr<Assimp::COB::Texture> local_660;
  shared_ptr<Assimp::COB::Texture> local_650;
  _Rb_tree_color local_640;
  _Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> local_638;
  _Rb_tree_node_base *local_5e8;
  _Rb_tree_node_base *local_5e0;
  COBImporter *local_5d8;
  undefined1 *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [16];
  char *local_5b0;
  float local_5a8;
  char local_5a0 [96];
  ios_base local_540 [264];
  aiString local_438;
  
  local_690 = fill;
  local_5d8 = this;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  uVar63 = (root->name)._M_string_length;
  if (uVar63 < 0x400) {
    (this_00->mName).length = (ai_uint32)uVar63;
    memcpy((this_00->mName).data,(root->name)._M_dataplus._M_p,uVar63);
    (this_00->mName).data[uVar63] = '\0';
  }
  fVar34 = (root->transform).a1;
  fVar35 = (root->transform).a2;
  fVar36 = (root->transform).a3;
  fVar37 = (root->transform).a4;
  fVar30 = (root->transform).b1;
  fVar31 = (root->transform).b2;
  fVar32 = (root->transform).b3;
  fVar33 = (root->transform).b4;
  fVar26 = (root->transform).c1;
  fVar27 = (root->transform).c2;
  fVar28 = (root->transform).c3;
  fVar29 = (root->transform).c4;
  fVar1 = (root->transform).d2;
  fVar24 = (root->transform).d3;
  fVar25 = (root->transform).d4;
  (this_00->mTransformation).d1 = (root->transform).d1;
  (this_00->mTransformation).d2 = fVar1;
  (this_00->mTransformation).d3 = fVar24;
  (this_00->mTransformation).d4 = fVar25;
  (this_00->mTransformation).c1 = fVar26;
  (this_00->mTransformation).c2 = fVar27;
  (this_00->mTransformation).c3 = fVar28;
  (this_00->mTransformation).c4 = fVar29;
  (this_00->mTransformation).b1 = fVar30;
  (this_00->mTransformation).b2 = fVar31;
  (this_00->mTransformation).b3 = fVar32;
  (this_00->mTransformation).b4 = fVar33;
  (this_00->mTransformation).a1 = fVar34;
  (this_00->mTransformation).a2 = fVar35;
  (this_00->mTransformation).a3 = fVar36;
  (this_00->mTransformation).a4 = fVar37;
  TVar9 = root->type;
  local_688 = scin;
  if (TVar9 == TYPE_CAMERA) {
    paVar54 = (aiCamera *)operator_new(0x438);
    (paVar54->mName).length = 0;
    (paVar54->mName).data[0] = '\0';
    memset((paVar54->mName).data + 1,0x1b,0x3ff);
    (paVar54->mPosition).x = 0.0;
    (paVar54->mPosition).y = 0.0;
    *(undefined8 *)&(paVar54->mPosition).z = 0;
    (paVar54->mUp).y = 1.0;
    (paVar54->mUp).z = 0.0;
    (paVar54->mLookAt).x = 0.0;
    (paVar54->mLookAt).y = 0.0;
    *(undefined8 *)&(paVar54->mLookAt).z = 0x3f490fdb3f800000;
    paVar54->mClipPlaneNear = 0.1;
    paVar54->mClipPlaneFar = 1000.0;
    paVar54->mAspect = 0.0;
    uVar41 = local_690->mNumCameras;
    local_690->mNumCameras = uVar41 + 1;
    local_690->mCameras[uVar41] = paVar54;
    uVar63 = (root->name)._M_string_length;
    if (uVar63 < 0x400) {
      (paVar54->mName).length = (ai_uint32)uVar63;
      memcpy((paVar54->mName).data,(root->name)._M_dataplus._M_p,uVar63);
      (paVar54->mName).data[uVar63] = '\0';
    }
  }
  else if (TVar9 == TYPE_LIGHT) {
    paVar53 = (aiLight *)operator_new(0x46c);
    (paVar53->mName).length = 0;
    (paVar53->mName).data[0] = '\0';
    memset((paVar53->mName).data + 1,0x1b,0x3ff);
    paVar53->mType = aiLightSource_UNDEFINED;
    (paVar53->mPosition).x = 0.0;
    (paVar53->mPosition).y = 0.0;
    (paVar53->mPosition).z = 0.0;
    (paVar53->mDirection).x = 0.0;
    (paVar53->mDirection).y = 0.0;
    *(undefined8 *)&(paVar53->mDirection).z = 0;
    (paVar53->mUp).x = 0.0;
    (paVar53->mUp).y = 0.0;
    *(undefined8 *)&(paVar53->mUp).z = 0;
    paVar53->mAttenuationLinear = 1.0;
    paVar53->mAttenuationQuadratic = 0.0;
    (paVar53->mColorDiffuse).r = 0.0;
    (paVar53->mColorDiffuse).g = 0.0;
    (paVar53->mColorDiffuse).b = 0.0;
    (paVar53->mColorSpecular).r = 0.0;
    (paVar53->mColorSpecular).g = 0.0;
    *(undefined8 *)&(paVar53->mColorSpecular).b = 0;
    (paVar53->mColorAmbient).g = 0.0;
    (paVar53->mColorAmbient).b = 0.0;
    paVar53->mAngleInnerCone = 6.2831855;
    paVar53->mAngleOuterCone = 6.2831855;
    (paVar53->mSize).x = 0.0;
    (paVar53->mSize).y = 0.0;
    uVar41 = local_690->mNumLights;
    local_690->mNumLights = uVar41 + 1;
    local_690->mLights[uVar41] = paVar53;
    uVar63 = (root->name)._M_string_length;
    if (uVar63 < 0x400) {
      (paVar53->mName).length = (ai_uint32)uVar63;
      memcpy((paVar53->mName).data,(root->name)._M_dataplus._M_p,uVar63);
      (paVar53->mName).data[uVar63] = '\0';
    }
    aVar22 = *(ai_real *)&root[1]._vptr_Node;
    aVar23 = *(ai_real *)((long)&root[1]._vptr_Node + 4);
    aVar2 = *(ai_real *)&root->field_0xd4;
    aVar20 = *(ai_real *)&root->field_0xd4;
    aVar21 = *(ai_real *)&root[1]._vptr_Node;
    (paVar53->mColorSpecular).g = aVar22;
    (paVar53->mColorSpecular).b = aVar23;
    (paVar53->mColorAmbient).r = aVar2;
    (paVar53->mColorAmbient).g = aVar22;
    (paVar53->mColorAmbient).b = aVar23;
    (paVar53->mColorDiffuse).r = aVar20;
    (paVar53->mColorDiffuse).g = aVar21;
    (paVar53->mColorDiffuse).b = aVar23;
    (paVar53->mColorSpecular).r = aVar2;
    uVar5 = root[1].super_ChunkInfo.id;
    uVar8 = root[1].super_ChunkInfo.parent_id;
    paVar53->mAngleInnerCone = (float)uVar8 * 0.017453292;
    paVar53->mAngleOuterCone = (float)uVar5 * 0.017453292;
    paVar53->mType = (uint)(root[1].super_ChunkInfo.version == 0) * 2 + aiLightSource_DIRECTIONAL;
  }
  else if (((TVar9 == TYPE_MESH) &&
           (root[1].temp_children.
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&root[1].type)) &&
          (*(_func_int ***)&root[1].super_ChunkInfo != root[1]._vptr_Node)) {
    p_Var52 = (_Rb_tree_node_base *)
              root[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    p_Var65 = (_Rb_tree_node_base *)
              &root[1].temp_children.
               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
    p_Var40 = p_Var65;
    if (p_Var52 != p_Var65) {
      do {
        local_5e8 = p_Var40;
        local_640 = p_Var52[1]._M_color;
        local_5e0 = p_Var52;
        std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::deque
                  ((deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)&local_638,
                   (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                   &p_Var52[1]._M_parent);
        if (local_638._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_638._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          uVar63 = 0;
          pppFVar57 = local_638._M_impl.super__Deque_impl_data._M_start._M_node;
          ppFVar59 = local_638._M_impl.super__Deque_impl_data._M_start._M_last;
          ppFVar60 = local_638._M_impl.super__Deque_impl_data._M_start._M_cur;
          do {
            ppFVar61 = ppFVar60 + 1;
            if (ppFVar61 == ppFVar59) {
              ppFVar61 = pppFVar57[1];
              pppFVar57 = pppFVar57 + 1;
              ppFVar59 = ppFVar61 + 0x40;
            }
            uVar63 = uVar63 + ((long)((*ppFVar60)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((*ppFVar60)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
            ppFVar60 = ppFVar61;
          } while (ppFVar61 != local_638._M_impl.super__Deque_impl_data._M_finish._M_cur);
          if (uVar63 != 0) {
            paVar43 = (aiMesh *)operator_new(0x520);
            paVar43->mPrimitiveTypes = 0;
            paVar43->mNumVertices = 0;
            paVar43->mNumFaces = 0;
            memset(&paVar43->mVertices,0,0xcc);
            paVar43->mBones = (aiBone **)0x0;
            paVar43->mMaterialIndex = 0;
            (paVar43->mName).length = 0;
            (paVar43->mName).data[0] = '\0';
            memset((paVar43->mName).data + 1,0x1b,0x3ff);
            paVar43->mNumAnimMeshes = 0;
            paVar43->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar43->mMethod = 0;
            (paVar43->mAABB).mMin.x = 0.0;
            (paVar43->mAABB).mMin.y = 0.0;
            (paVar43->mAABB).mMin.z = 0.0;
            (paVar43->mAABB).mMax.x = 0.0;
            (paVar43->mAABB).mMax.y = 0.0;
            (paVar43->mAABB).mMax.z = 0.0;
            memset(paVar43->mColors,0,0xa0);
            uVar41 = local_690->mNumMeshes;
            local_690->mNumMeshes = uVar41 + 1;
            local_690->mMeshes[uVar41] = paVar43;
            this_00->mNumMeshes = this_00->mNumMeshes + 1;
            auVar19._8_8_ = 0;
            auVar19._0_8_ = uVar63;
            uVar44 = SUB168(auVar19 * ZEXT816(0xc),0);
            uVar63 = uVar44;
            if (SUB168(auVar19 * ZEXT816(0xc),8) != 0) {
              uVar63 = 0xffffffffffffffff;
            }
            paVar45 = (aiVector3D *)operator_new__(uVar63);
            sVar64 = ((uVar44 - 0xc) / 0xc) * 0xc + 0xc;
            memset(paVar45,0,sVar64);
            paVar43->mVertices = paVar45;
            paVar45 = (aiVector3D *)operator_new__(uVar63);
            memset(paVar45,0,sVar64);
            ppFVar59 = local_638._M_impl.super__Deque_impl_data._M_start._M_last;
            ppFVar60 = local_638._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_680 = local_638._M_impl.super__Deque_impl_data._M_start._M_node;
            paVar43->mTextureCoords[0] = paVar45;
            local_678 = local_638._M_impl.super__Deque_impl_data._M_finish._M_cur;
            uVar63 = ((long)local_638._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_638._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                     ((long)local_638._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_638._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                     ((((ulong)((long)local_638._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_638._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) +
                     (ulong)(local_638._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x40;
            puVar46 = (ulong *)operator_new__(-(ulong)(uVar63 >> 0x3c != 0) | uVar63 * 0x10 | 8);
            *puVar46 = uVar63;
            paVar47 = (aiFace *)(puVar46 + 1);
            if (uVar63 != 0) {
              paVar58 = paVar47;
              do {
                paVar58->mNumIndices = 0;
                paVar58->mIndices = (uint *)0x0;
                paVar58 = paVar58 + 1;
              } while (paVar58 != paVar47 + uVar63);
            }
            paVar43->mFaces = paVar47;
            while (paVar38 = local_690, ppFVar60 != local_678) {
              pFVar11 = *ppFVar60;
              if ((pFVar11->indices).
                  super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pFVar11->indices).
                  super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar41 = paVar43->mNumFaces;
                paVar43->mNumFaces = uVar41 + 1;
                paVar47 = paVar43->mFaces + uVar41;
                lVar48 = (long)(pFVar11->indices).
                               super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pFVar11->indices).
                               super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                uVar63 = lVar48 >> 1;
                if (lVar48 < 0) {
                  uVar63 = 0xffffffffffffffff;
                }
                puVar49 = (uint *)operator_new__(uVar63);
                paVar47->mIndices = puVar49;
                pVVar12 = (pFVar11->indices).
                          super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (pVVar50 = (pFVar11->indices).
                               super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                               ._M_impl.super__Vector_impl_data._M_start; pVVar50 != pVVar12;
                    pVVar50 = pVVar50 + 1) {
                  uVar63 = (ulong)pVVar50->pos_idx;
                  lVar48 = *(long *)&root[1].type;
                  uVar44 = ((long)root[1].temp_children.
                                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                  ._M_impl.super__Deque_impl_data._M_map - lVar48 >> 2) *
                           -0x5555555555555555;
                  if (uVar44 < uVar63 || uVar44 - uVar63 == 0) {
                    local_438._0_8_ = local_438.data + 0xc;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_438,"Position index out of range","");
                    ThrowException((string *)&local_438);
                  }
                  if ((ulong)(*(long *)&root[1].super_ChunkInfo - (long)root[1]._vptr_Node >> 3) <=
                      (ulong)pVVar50->uv_idx) {
                    local_438._0_8_ = local_438.data + 0xc;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_438,"UV index out of range","");
                    ThrowException((string *)&local_438);
                  }
                  paVar45 = paVar43->mVertices;
                  uVar41 = paVar43->mNumVertices;
                  paVar45[uVar41].z = *(float *)(lVar48 + 8 + uVar63 * 0xc);
                  uVar13 = *(undefined8 *)(lVar48 + uVar63 * 0xc);
                  paVar45 = paVar45 + uVar41;
                  paVar45->x = (float)(int)uVar13;
                  paVar45->y = (float)(int)((ulong)uVar13 >> 0x20);
                  paVar45 = paVar43->mTextureCoords[0];
                  uVar41 = paVar43->mNumVertices;
                  *(_func_int **)(paVar45 + uVar41) = root[1]._vptr_Node[pVVar50->uv_idx];
                  paVar45[uVar41].z = 0.0;
                  uVar41 = paVar43->mNumVertices;
                  paVar43->mNumVertices = uVar41 + 1;
                  uVar56 = paVar47->mNumIndices;
                  paVar47->mNumIndices = uVar56 + 1;
                  paVar47->mIndices[uVar56] = uVar41;
                }
              }
              ppFVar60 = ppFVar60 + 1;
              if (ppFVar60 == ppFVar59) {
                ppFVar60 = local_680[1];
                local_680 = local_680 + 1;
                ppFVar59 = ppFVar60 + 0x40;
              }
            }
            paVar43->mMaterialIndex = local_690->mNumMaterials;
            pMVar51 = (local_688->materials).
                      super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar14 = (local_688->materials).
                      super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pMVar51 != pMVar14) {
              do {
                if (((pMVar51->super_ChunkInfo).parent_id == (root->super_ChunkInfo).id) &&
                   (pMVar51->matnum == local_640)) {
                  local_698 = (pointer)0x0;
                  goto LAB_00477b23;
                }
                pMVar51 = pMVar51 + 1;
              } while (pMVar51 != pMVar14);
            }
            local_698 = (Material *)0x0;
            this_01 = DefaultLogger::get();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438,"Could not resolve material index ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438," - creating default material for this slot",0x2a);
            std::__cxx11::stringbuf::str();
            Logger::debug(this_01,local_5b0);
            if (local_5b0 != local_5a0) {
              operator_delete(local_5b0);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
            std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
            pMVar51 = (pointer)operator_new(0x90);
            __ptr = local_698;
            (pMVar51->super_ChunkInfo).id = 0;
            (pMVar51->super_ChunkInfo).parent_id = 0;
            (pMVar51->super_ChunkInfo).version = 0;
            (pMVar51->super_ChunkInfo).size = 0xffffffff;
            (pMVar51->type)._M_dataplus._M_p = (pointer)&(pMVar51->type).field_2;
            (pMVar51->type)._M_string_length = 0;
            (pMVar51->type).field_2._M_local_buf[0] = '\0';
            (pMVar51->rgb).r = 0.0;
            (pMVar51->rgb).g = 0.0;
            *(undefined8 *)&(pMVar51->rgb).b = 0;
            pMVar51->alpha = 0.0;
            pMVar51->exp = 0.0;
            pMVar51->ior = 0.0;
            pMVar51->ka = 0.0;
            pMVar51->ks = 1.0;
            pMVar51->matnum = 0xffffffff;
            pMVar51->shader = FLAT;
            pMVar51->autofacet = FACETED;
            *(undefined8 *)&pMVar51->autofacet_angle = 0;
            *(undefined8 *)
             ((long)&(pMVar51->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar51->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            *(undefined8 *)
             ((long)&(pMVar51->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar51->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            (pMVar51->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pMVar51->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar67 = local_698 != (Material *)0x0;
            local_698 = pMVar51;
            if (bVar67) {
              std::default_delete<const_Assimp::COB::Material>::operator()
                        ((default_delete<const_Assimp::COB::Material> *)&local_698,__ptr);
            }
LAB_00477b23:
            this_02 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(this_02);
            uVar41 = paVar38->mNumMaterials;
            paVar38->mNumMaterials = uVar41 + 1;
            paVar38->mMaterials[uVar41] = this_02;
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[6]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_5b0,(char (*) [6])"#mat_");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b0,"_",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
            std::__cxx11::stringbuf::str();
            puVar39 = local_5d0;
            sVar64 = local_5c8 & 0xffffffff;
            if ((local_5c8 & 0xfffffc00) != 0) {
              sVar64 = 0x3ff;
            }
            local_438.length = (ai_uint32)sVar64;
            memcpy((void *)((long)&local_438 + 4),local_5d0,sVar64);
            *(undefined1 *)((long)&local_438 + sVar64 + 4) = 0;
            if (puVar39 != local_5c0) {
              operator_delete(puVar39);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b0);
            std::ios_base::~ios_base(local_540);
            aiMaterial::AddProperty(this_02,&local_438,"?mat.name",0,0);
            p_Var65 = local_5e8;
            uVar41 = *(uint *)&root[1].temp_children.
                               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node & 4;
            uVar56 = uVar41 >> 2;
            local_5b0._0_4_ = uVar56;
            if (uVar41 != 0) {
              aiMaterial::AddBinaryProperty(this_02,&local_5b0,4,"$mat.wireframe",0,0,aiPTI_Integer)
              ;
            }
            SVar10 = pMVar51->shader;
            if (SVar10 == METAL) {
              local_5b0 = (char *)CONCAT44(local_5b0._4_4_,8);
            }
            else if (SVar10 == PHONG) {
              local_5b0 = (char *)CONCAT44(local_5b0._4_4_,3);
            }
            else {
              if (SVar10 != FLAT) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/COB/COBLoader.cpp"
                              ,0x152,
                              "aiNode *Assimp::COBImporter::BuildNodes(const Node &, const Scene &, aiScene *)"
                             );
              }
              local_5b0 = (char *)CONCAT44(local_5b0._4_4_,2);
            }
            aiMaterial::AddBinaryProperty(this_02,&local_5b0,4,"$mat.shadingm",0,0,aiPTI_Integer);
            if ((uint)local_5b0 != 2) {
              aiMaterial::AddBinaryProperty
                        (this_02,&pMVar51->exp,4,"$mat.shininess",0,0,aiPTI_Float);
            }
            aiMaterial::AddBinaryProperty(this_02,&pMVar51->ior,4,"$mat.refracti",0,0,aiPTI_Float);
            aiMaterial::AddBinaryProperty(this_02,&pMVar51->rgb,0xc,"$clr.diffuse",0,0,aiPTI_Float);
            fVar1 = pMVar51->ks;
            local_5a8 = (pMVar51->rgb).b * fVar1;
            uVar3 = (pMVar51->rgb).r;
            uVar6 = (pMVar51->rgb).g;
            local_5b0 = (char *)CONCAT44(fVar1 * (float)uVar6,fVar1 * (float)uVar3);
            aiMaterial::AddBinaryProperty(this_02,&local_5b0,0xc,"$clr.specular",0,0,aiPTI_Float);
            fVar1 = pMVar51->ka;
            local_5a8 = (pMVar51->rgb).b * fVar1;
            uVar4 = (pMVar51->rgb).r;
            uVar7 = (pMVar51->rgb).g;
            local_5b0 = (char *)CONCAT44(fVar1 * (float)uVar7,fVar1 * (float)uVar4);
            aiMaterial::AddBinaryProperty(this_02,&local_5b0,0xc,"$clr.ambient",0,0,aiPTI_Float);
            peVar15 = (pMVar51->tex_color).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar15 != (element_type *)0x0) {
              local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pMVar51->tex_color).
                   super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_650.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_650.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar15;
              ConvertTexture(&local_650,this_02,aiTextureType_DIFFUSE);
              if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_650.
                           super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            peVar15 = (pMVar51->tex_env).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar15 != (element_type *)0x0) {
              local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pMVar51->tex_env).
                   super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_660.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_660.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar15;
              ConvertTexture(&local_660,this_02,aiTextureType_UNKNOWN);
              if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_660.
                           super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            peVar15 = (pMVar51->tex_bump).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar15 != (element_type *)0x0) {
              local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pMVar51->tex_bump).
                   super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_670.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_670.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar15;
              ConvertTexture(&local_670,this_02,aiTextureType_HEIGHT);
              if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_670.
                           super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            if (local_698 != (Material *)0x0) {
              std::default_delete<const_Assimp::COB::Material>::operator()
                        ((default_delete<const_Assimp::COB::Material> *)&local_698,local_698);
            }
          }
        }
        std::_Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::~_Deque_base
                  (&local_638);
        p_Var52 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_5e0);
        p_Var40 = local_5e8;
      } while (p_Var52 != p_Var65);
    }
  }
  paVar38 = local_690;
  if ((ulong)this_00->mNumMeshes != 0) {
    puVar49 = (uint *)operator_new__((ulong)this_00->mNumMeshes << 2);
    this_00->mMeshes = puVar49;
    iVar42 = -1;
    uVar63 = 0;
    do {
      this_00->mMeshes[uVar63] = paVar38->mNumMeshes + iVar42;
      uVar63 = uVar63 + 1;
      iVar42 = iVar42 + -1;
    } while (uVar63 < this_00->mNumMeshes);
  }
  pppNVar16 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppNVar62 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppNVar17 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppNVar66 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppNVar18 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar63 = ((long)ppNVar18 - (long)ppNVar66 >> 3) +
           ((long)ppNVar17 -
            (long)(root->temp_children).
                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppNVar16 - (long)pppNVar62) >> 3) - 1) +
           (ulong)(pppNVar16 == (_Map_pointer)0x0)) * 0x40;
  uVar63 = -(ulong)(uVar63 >> 0x3d != 0) | uVar63 * 8;
  __s = (aiNode **)operator_new__(uVar63);
  paVar38 = local_690;
  memset(__s,0,uVar63);
  scin_00 = local_688;
  this_00->mChildren = __s;
  while (ppNVar66 != ppNVar17) {
    paVar55 = BuildNodes(local_5d8,*ppNVar66,scin_00,paVar38);
    uVar41 = this_00->mNumChildren;
    this_00->mNumChildren = uVar41 + 1;
    this_00->mChildren[uVar41] = paVar55;
    paVar55->mParent = this_00;
    ppNVar66 = ppNVar66 + 1;
    if (ppNVar66 == ppNVar18) {
      ppNVar66 = pppNVar62[1];
      pppNVar62 = pppNVar62 + 1;
      ppNVar18 = ppNVar66 + 0x40;
    }
  }
  return this_00;
}

Assistant:

aiNode* COBImporter::BuildNodes(const Node& root,const Scene& scin,aiScene* fill)
{
    aiNode* nd = new aiNode();
    nd->mName.Set(root.name);
    nd->mTransformation = root.transform;

    // Note to everybody believing Voodoo is appropriate here:
    // I know polymorphism, run as fast as you can ;-)
    if (Node::TYPE_MESH == root.type) {
        const Mesh& ndmesh = (const Mesh&)(root);
        if (ndmesh.vertex_positions.size() && ndmesh.texture_coords.size()) {

            typedef std::pair<unsigned int,Mesh::FaceRefList> Entry;
            for(const Entry& reflist : ndmesh.temp_map) {
                {   // create mesh
                    size_t n = 0;
                    for(Face* f : reflist.second) {
                        n += f->indices.size();
                    }
                    if (!n) {
                        continue;
                    }
                    aiMesh* outmesh = fill->mMeshes[fill->mNumMeshes++] = new aiMesh();
                    ++nd->mNumMeshes;

                    outmesh->mVertices = new aiVector3D[n];
                    outmesh->mTextureCoords[0] = new aiVector3D[n];

                    outmesh->mFaces = new aiFace[reflist.second.size()]();
                    for(Face* f : reflist.second) {
                        if (f->indices.empty()) {
                            continue;
                        }

                        aiFace& fout = outmesh->mFaces[outmesh->mNumFaces++];
                        fout.mIndices = new unsigned int[f->indices.size()];

                        for(VertexIndex& v : f->indices) {
                            if (v.pos_idx >= ndmesh.vertex_positions.size()) {
                                ThrowException("Position index out of range");
                            }
                            if (v.uv_idx >= ndmesh.texture_coords.size()) {
                                ThrowException("UV index out of range");
                            }
                            outmesh->mVertices[outmesh->mNumVertices] = ndmesh.vertex_positions[ v.pos_idx ];
                            outmesh->mTextureCoords[0][outmesh->mNumVertices] = aiVector3D(
                                ndmesh.texture_coords[ v.uv_idx ].x,
                                ndmesh.texture_coords[ v.uv_idx ].y,
                                0.f
                            );

                            fout.mIndices[fout.mNumIndices++] = outmesh->mNumVertices++;
                        }
                    }
                    outmesh->mMaterialIndex = fill->mNumMaterials;
                }{  // create material
                    const Material* min = NULL;
                    for(const Material& m : scin.materials) {
                        if (m.parent_id == ndmesh.id && m.matnum == reflist.first) {
                            min = &m;
                            break;
                        }
                    }
                    std::unique_ptr<const Material> defmat;
                    if(!min) {
                        ASSIMP_LOG_DEBUG(format()<<"Could not resolve material index "
                            <<reflist.first<<" - creating default material for this slot");

                        defmat.reset(min=new Material());
                    }

                    aiMaterial* mat = new aiMaterial();
                    fill->mMaterials[fill->mNumMaterials++] = mat;

                    const aiString s(format("#mat_")<<fill->mNumMeshes<<"_"<<min->matnum);
                    mat->AddProperty(&s,AI_MATKEY_NAME);

                    if(int tmp = ndmesh.draw_flags & Mesh::WIRED ? 1 : 0) {
                        mat->AddProperty(&tmp,1,AI_MATKEY_ENABLE_WIREFRAME);
                    }

                    {   int shader;
                        switch(min->shader)
                        {
                        case Material::FLAT:
                            shader = aiShadingMode_Gouraud;
                            break;

                        case Material::PHONG:
                            shader = aiShadingMode_Phong;
                            break;

                        case Material::METAL:
                            shader = aiShadingMode_CookTorrance;
                            break;

                        default:
                            ai_assert(false); // shouldn't be here
                        }
                        mat->AddProperty(&shader,1,AI_MATKEY_SHADING_MODEL);
                        if(shader != aiShadingMode_Gouraud) {
                            mat->AddProperty(&min->exp,1,AI_MATKEY_SHININESS);
                        }
                    }

                    mat->AddProperty(&min->ior,1,AI_MATKEY_REFRACTI);
                    mat->AddProperty(&min->rgb,1,AI_MATKEY_COLOR_DIFFUSE);

                    aiColor3D c = aiColor3D(min->rgb)*min->ks;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);

                    c = aiColor3D(min->rgb)*min->ka;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);

                    // convert textures if some exist.
                    if(min->tex_color) {
                        ConvertTexture(min->tex_color,mat,aiTextureType_DIFFUSE);
                    }
                    if(min->tex_env) {
                        ConvertTexture(min->tex_env  ,mat,aiTextureType_UNKNOWN);
                    }
                    if(min->tex_bump) {
                        ConvertTexture(min->tex_bump ,mat,aiTextureType_HEIGHT);
                    }
                }
            }
        }
    }
    else if (Node::TYPE_LIGHT == root.type) {
        const Light& ndlight = (const Light&)(root);
        aiLight* outlight = fill->mLights[fill->mNumLights++] = new aiLight();

        outlight->mName.Set(ndlight.name);
        outlight->mColorDiffuse = outlight->mColorAmbient = outlight->mColorSpecular = ndlight.color;

        outlight->mAngleOuterCone = AI_DEG_TO_RAD(ndlight.angle);
        outlight->mAngleInnerCone = AI_DEG_TO_RAD(ndlight.inner_angle);

        // XXX
        outlight->mType = ndlight.ltype==Light::SPOT ? aiLightSource_SPOT : aiLightSource_DIRECTIONAL;
    }
    else if (Node::TYPE_CAMERA == root.type) {
        const Camera& ndcam = (const Camera&)(root);
        aiCamera* outcam = fill->mCameras[fill->mNumCameras++] = new aiCamera();

        outcam->mName.Set(ndcam.name);
    }

    // add meshes
    if (nd->mNumMeshes) { // mMeshes must be NULL if count is 0
        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; i < nd->mNumMeshes;++i) {
            nd->mMeshes[i] = fill->mNumMeshes-i-1;
        }
    }

    // add children recursively
    nd->mChildren = new aiNode*[root.temp_children.size()]();
    for(const Node* n : root.temp_children) {
        (nd->mChildren[nd->mNumChildren++] = BuildNodes(*n,scin,fill))->mParent = nd;
    }

    return nd;
}